

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.h
# Opt level: O0

ComponentPtr __thiscall
Kompositum::buildComposite(Kompositum *this,IDType id,ParentChildTreeDef *treeMap)

{
  bool bVar1;
  pointer this_00;
  pointer ppVar2;
  pair<std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  pVar3;
  unique_ptr<Kompositum::Leaf,_std::default_delete<Kompositum::Leaf>_> local_78;
  ComponentPtr local_70;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> local_68;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> child;
  pair<std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  range;
  unique_ptr<Kompositum::Composite,_std::default_delete<Kompositum::Composite>_> composite;
  _Self local_30;
  undefined1 local_21;
  ParentChildTreeDef *pPStack_20;
  bool hasChildren;
  ParentChildTreeDef *treeMap_local;
  IDType id_local;
  
  pPStack_20 = treeMap;
  treeMap_local = (ParentChildTreeDef *)id;
  id_local = (IDType)this;
  local_30._M_node =
       (_Base_ptr)
       std::
       multimap<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
       ::find(treeMap,(key_type *)&treeMap_local);
  composite._M_t.
  super___uniq_ptr_impl<Kompositum::Composite,_std::default_delete<Kompositum::Composite>_>._M_t.
  super__Tuple_impl<0UL,_Kompositum::Composite_*,_std::default_delete<Kompositum::Composite>_>.
  super__Head_base<0UL,_Kompositum::Composite_*,_false>._M_head_impl =
       (__uniq_ptr_data<Kompositum::Composite,_std::default_delete<Kompositum::Composite>,_true,_true>
        )std::
         multimap<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
         ::end(pPStack_20);
  local_21 = std::operator!=(&local_30,(_Self *)&composite);
  if ((bool)local_21) {
    make_unique<Kompositum::Composite,unsigned_long&>
              ((Kompositum *)&range.second,(unsigned_long *)&treeMap_local);
    pVar3 = std::
            multimap<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
            ::equal_range(pPStack_20,(key_type *)&treeMap_local);
    while( true ) {
      range.first = pVar3.second._M_node;
      local_68 = pVar3.first._M_node;
      bVar1 = std::operator!=(&local_68,&range.first);
      if (!bVar1) break;
      this_00 = std::unique_ptr<Kompositum::Composite,_std::default_delete<Kompositum::Composite>_>
                ::operator->((unique_ptr<Kompositum::Composite,_std::default_delete<Kompositum::Composite>_>
                              *)&range.second);
      ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::
               operator->(&local_68);
      buildComposite((Kompositum *)&local_70,ppVar2->second,pPStack_20);
      Composite::addChild(this_00,&local_70);
      std::unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_>::
      ~unique_ptr(&local_70);
      std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator++
                (&local_68);
      pVar3.second._M_node = range.first._M_node;
      pVar3.first._M_node = local_68._M_node;
    }
    std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>::
    unique_ptr<Kompositum::Composite,std::default_delete<Kompositum::Composite>,void>
              ((unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>> *)this,
               (unique_ptr<Kompositum::Composite,_std::default_delete<Kompositum::Composite>_> *)
               &range.second);
    std::unique_ptr<Kompositum::Composite,_std::default_delete<Kompositum::Composite>_>::~unique_ptr
              ((unique_ptr<Kompositum::Composite,_std::default_delete<Kompositum::Composite>_> *)
               &range.second);
  }
  else {
    make_unique<Kompositum::Leaf,unsigned_long&>
              ((Kompositum *)&local_78,(unsigned_long *)&treeMap_local);
    std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>::
    unique_ptr<Kompositum::Leaf,std::default_delete<Kompositum::Leaf>,void>
              ((unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>> *)this,
               &local_78);
    std::unique_ptr<Kompositum::Leaf,_std::default_delete<Kompositum::Leaf>_>::~unique_ptr
              (&local_78);
  }
  return (__uniq_ptr_data<Kompositum::Component,_std::default_delete<Kompositum::Component>,_true,_true>
          )(__uniq_ptr_data<Kompositum::Component,_std::default_delete<Kompositum::Component>,_true,_true>
            )this;
}

Assistant:

ComponentPtr buildComposite(IDType id, const ParentChildTreeDef& treeMap) {
    const bool hasChildren = treeMap.find(id) != treeMap.end();
    if (hasChildren) {
        auto composite = make_unique<Composite>(id);

        auto range = treeMap.equal_range(id);
        for (auto child = range.first; child != range.second; ++child) {
            composite->addChild(buildComposite(child->second, treeMap));
        }

        return std::move(composite);
    }

    return make_unique<Leaf>(id);
}